

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O2

int sfd_tran_pipe_init(void *arg,nni_pipe *npipe)

{
  *(nni_pipe **)((long)arg + 8) = npipe;
  nni_mtx_init((nni_mtx *)((long)arg + 0x600));
  nni_aio_init((nni_aio *)((long)arg + 0xa0),sfd_tran_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x268),sfd_tran_pipe_recv_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x430),sfd_tran_pipe_nego_cb,arg);
  nni_aio_list_init((nni_list *)((long)arg + 0x70));
  nni_aio_list_init((nni_list *)((long)arg + 0x88));
  return 0;
}

Assistant:

static int
sfd_tran_pipe_init(void *arg, nni_pipe *npipe)
{
	sfd_tran_pipe *p = arg;
	p->npipe         = npipe;
	nni_mtx_init(&p->mtx);
	nni_aio_init(&p->txaio, sfd_tran_pipe_send_cb, p);
	nni_aio_init(&p->rxaio, sfd_tran_pipe_recv_cb, p);
	nni_aio_init(&p->negoaio, sfd_tran_pipe_nego_cb, p);
	nni_aio_list_init(&p->recvq);
	nni_aio_list_init(&p->sendq);

	return (0);
}